

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

void __thiscall Centaurus::DFA<char>::~DFA(DFA<char> *this)

{
  NFABase<Centaurus::DFAState<char>_>::~NFABase(&this->super_NFABase<Centaurus::DFAState<char>_>);
  operator_delete(this);
  return;
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const override
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		os << L"SS [ style=\"invisible\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			if (m_states[i].is_accept_state())
				os << L"\", shape=doublecircle";
			else
				os << L"\", shape=circle";
            if (m_states[i].is_long())
                os << L", penwidth=2 ];" << std::endl;
            else
                os << L" ];" << std::endl;
		}

		os << L"SS -> S0;" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}